

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_set.h
# Opt level: O1

void __thiscall merlin::variable_set::~variable_set(variable_set *this)

{
  pointer puVar1;
  
  puVar1 = (this->m_dlocal).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  puVar1 = (this->m_v).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
    return;
  }
  return;
}

Assistant:

~variable_set(void) {
	}